

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc4.cc
# Opt level: O0

void RC4(RC4_KEY *key,size_t len,uchar *indata,uchar *outdata)

{
  uint uVar1;
  uint uVar2;
  uint32_t ty;
  uint32_t tx;
  size_t i;
  uint32_t *d;
  uint32_t y;
  uint32_t x;
  uint8_t *out_local;
  uint8_t *in_local;
  size_t len_local;
  RC4_KEY *key_local;
  
  d._4_4_ = key->x;
  d._0_4_ = key->y;
  for (_ty = 0; _ty < len; _ty = _ty + 1) {
    d._4_4_ = d._4_4_ + 1 & 0xff;
    uVar1 = key->data[d._4_4_];
    d._0_4_ = uVar1 + (uint)d & 0xff;
    uVar2 = key->data[(uint)d];
    key->data[d._4_4_] = uVar2;
    key->data[(uint)d] = uVar1;
    outdata[_ty] = (byte)key->data[uVar1 + uVar2 & 0xff] ^ indata[_ty];
  }
  key->x = d._4_4_;
  key->y = (uint)d;
  return;
}

Assistant:

void RC4(RC4_KEY *key, size_t len, const uint8_t *in, uint8_t *out) {
  uint32_t x = key->x;
  uint32_t y = key->y;
  uint32_t *d = key->data;

  for (size_t i = 0; i < len; i++) {
    x = (x + 1) & 0xff;
    uint32_t tx = d[x];
    y = (tx + y) & 0xff;
    uint32_t ty = d[y];
    d[x] = ty;
    d[y] = tx;
    out[i] = d[(tx + ty) & 0xff] ^ in[i];
  }

  key->x = x;
  key->y = y;
}